

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackBackTrace.h
# Opt level: O2

void StackBackTraceNode::PrintAll(StackBackTraceNode *head)

{
  code *pcVar1;
  bool bVar2;
  StackBackTraceNode *pSVar3;
  undefined4 *puVar4;
  StackBackTraceNode *pSVar5;
  StackBackTraceNode *pSVar6;
  
  pSVar6 = head;
  pSVar5 = (StackBackTraceNode *)0x0;
  while (pSVar3 = pSVar6, pSVar3 != (StackBackTraceNode *)0x0) {
    pSVar6 = pSVar3->next;
    pSVar3->next = pSVar5;
    pSVar5 = pSVar3;
  }
  pSVar6 = (StackBackTraceNode *)0x0;
  while (pSVar3 = pSVar5, pSVar3 != (StackBackTraceNode *)0x0) {
    StackBackTrace::Print(pSVar3->stackBackTrace);
    pSVar5 = pSVar3->next;
    pSVar3->next = pSVar6;
    pSVar6 = pSVar3;
  }
  if (pSVar6 != head) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/StackBackTrace.h"
                       ,0x79,"(prev == head)","prev == head");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

static void PrintAll(StackBackTraceNode * head)
    {
        // We want to print them tail first because that is the first stack trace we added

        // Reverse the list
        StackBackTraceNode * curr = head;
        StackBackTraceNode * prev = nullptr;
        while (curr != nullptr)
        {
            StackBackTraceNode * next = curr->next;
            curr->next = prev;
            prev = curr;
            curr = next;
        }

        // print and reverse again.
        curr = prev;
        prev = nullptr;
        while (curr != nullptr)
        {
            curr->stackBackTrace->Print();
            StackBackTraceNode * next = curr->next;
            curr->next = prev;
            prev = curr;
            curr = next;
        }

        Assert(prev == head);
    }